

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O2

void Cec_ObjAddToFrontier(Cec_ManSat_t *p,Gia_Obj_t *pObj,Vec_Ptr_t *vFrontier)

{
  int iVar1;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                  ,0x11b,"void Cec_ObjAddToFrontier(Cec_ManSat_t *, Gia_Obj_t *, Vec_Ptr_t *)");
  }
  iVar1 = Cec_ObjSatNum(p,pObj);
  if (iVar1 == 0) {
    iVar1 = Cec_ObjSatNum(p,pObj);
    if (iVar1 != 0) {
      __assert_fail("Cec_ObjSatNum(p,pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                    ,0x11e,"void Cec_ObjAddToFrontier(Cec_ManSat_t *, Gia_Obj_t *, Vec_Ptr_t *)");
    }
    if ((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) {
      Vec_PtrPush(p->vUsedNodes,pObj);
      iVar1 = p->nSatVars;
      p->nSatVars = iVar1 + 1;
      Cec_ObjSetSatNum(p,pObj,iVar1);
      if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
        Vec_PtrPush(vFrontier,pObj);
        return;
      }
    }
  }
  return;
}

Assistant:

void Cec_ObjAddToFrontier( Cec_ManSat_t * p, Gia_Obj_t * pObj, Vec_Ptr_t * vFrontier )
{
    assert( !Gia_IsComplement(pObj) );
    if ( Cec_ObjSatNum(p,pObj) )
        return;
    assert( Cec_ObjSatNum(p,pObj) == 0 );
    if ( Gia_ObjIsConst0(pObj) )
        return;
    Vec_PtrPush( p->vUsedNodes, pObj );
    Cec_ObjSetSatNum( p, pObj, p->nSatVars++ );
    if ( Gia_ObjIsAnd(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}